

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

QString * Mustache::renderTemplate
                    (QString *__return_storage_ptr__,QString *templateString,QVariantHash *args)

{
  undefined1 local_128 [8];
  Renderer renderer;
  QVariant local_68;
  undefined1 local_48 [8];
  QtVariantContext context;
  QVariantHash *args_local;
  QString *templateString_local;
  
  context.m_contextStack.super_QList<QVariant>.d.size = (qsizetype)args;
  ::QVariant::QVariant(&local_68,(QHash_conflict *)args);
  QtVariantContext::QtVariantContext((QtVariantContext *)local_48,&local_68,(PartialResolver *)0x0);
  ::QVariant::~QVariant(&local_68);
  Renderer::Renderer((Renderer *)local_128);
  Renderer::render(__return_storage_ptr__,(Renderer *)local_128,templateString,(Context *)local_48);
  Renderer::~Renderer((Renderer *)local_128);
  QtVariantContext::~QtVariantContext((QtVariantContext *)local_48);
  return __return_storage_ptr__;
}

Assistant:

QString Mustache::renderTemplate(const QString& templateString, const QVariantHash& args)
{
	Mustache::QtVariantContext context(args);
	Mustache::Renderer renderer;
	return renderer.render(templateString, &context);
}